

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_run_every(size_t milliseconds,size_t repetitions,_func_void_void_ptr *task,void *arg,
                 _func_void_void_ptr *on_finish)

{
  fio_timer_s *timer;
  int *piVar1;
  int iVar2;
  timespec tVar3;
  
  iVar2 = -1;
  if ((repetitions != 0 || milliseconds != 0) && task != (_func_void_void_ptr *)0x0) {
    timer = (fio_timer_s *)malloc(0x48);
    if (timer == (fio_timer_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:1307"
                      );
      }
      kill(0,2);
      piVar1 = __errno_location();
      exit(*piVar1);
    }
    iVar2 = 0;
    clock_gettime(0,(timespec *)fio_data);
    tVar3 = fio_timer_calc_due(milliseconds);
    (timer->node).prev = (fio_ls_embd_s *)0x0;
    (timer->node).next = (fio_ls_embd_s *)0x0;
    timer->due = tVar3;
    timer->interval = milliseconds;
    timer->repetitions = repetitions;
    timer->task = task;
    timer->arg = arg;
    timer->on_finish = on_finish;
    fio_timer_add_order(timer);
  }
  return iVar2;
}

Assistant:

int fio_run_every(size_t milliseconds, size_t repetitions, void (*task)(void *),
                  void *arg, void (*on_finish)(void *)) {
  if (!task || (milliseconds == 0 && !repetitions))
    return -1;
  fio_timer_s *timer = malloc(sizeof(*timer));
  FIO_ASSERT_ALLOC(timer);
  fio_mark_time();
  *timer = (fio_timer_s){
      .due = fio_timer_calc_due(milliseconds),
      .interval = milliseconds,
      .repetitions = repetitions,
      .task = task,
      .arg = arg,
      .on_finish = on_finish,
  };
  fio_timer_add_order(timer);
  return 0;
}